

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O3

void __thiscall
chrono::ChContactContainerNSC::AddContact(ChContactContainerNSC *this,ChCollisionInfo *cinfo)

{
  ChContactable *pCVar1;
  ChContactable *pCVar2;
  ChMaterialCompositionStrategy *strategy;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long *plVar3;
  int iVar4;
  ChMaterialCompositeNSC cmat;
  shared_ptr<chrono::ChMaterialSurfaceNSC> local_88;
  shared_ptr<chrono::ChMaterialSurfaceNSC> local_78;
  long *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  ChMaterialCompositeNSC local_58;
  
  pCVar1 = cinfo->modelA->mcontactable;
  if (pCVar1 == (ChContactable *)0x0) {
    __assert_fail("cinfo.modelA->GetContactable()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactContainerNSC.cpp"
                  ,0xe0,
                  "virtual void chrono::ChContactContainerNSC::AddContact(const collision::ChCollisionInfo &)"
                 );
  }
  pCVar2 = cinfo->modelB->mcontactable;
  if (pCVar2 == (ChContactable *)0x0) {
    __assert_fail("cinfo.modelB->GetContactable()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactContainerNSC.cpp"
                  ,0xe1,
                  "virtual void chrono::ChContactContainerNSC::AddContact(const collision::ChCollisionInfo &)"
                 );
  }
  iVar4 = (*pCVar1->_vptr_ChContactable[2])();
  if (((char)iVar4 == '\0') &&
     (iVar4 = (*pCVar2->_vptr_ChContactable[2])(pCVar2), (char)iVar4 == '\0')) {
    return;
  }
  iVar4 = (*((cinfo->shapeA->m_material).
             super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_ChMaterialSurface[3])();
  if (iVar4 != 0) {
    return;
  }
  iVar4 = (*((cinfo->shapeB->m_material).
             super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_ChMaterialSurface[3])();
  if (iVar4 != 0) {
    return;
  }
  strategy = (((this->super_ChContactContainer).super_ChPhysicsItem.system)->composition_strategy).
             _M_t.
             super___uniq_ptr_impl<chrono::ChMaterialCompositionStrategy,_std::default_delete<chrono::ChMaterialCompositionStrategy>_>
             ._M_t.
             super__Tuple_impl<0UL,_chrono::ChMaterialCompositionStrategy_*,_std::default_delete<chrono::ChMaterialCompositionStrategy>_>
             .super__Head_base<0UL,_chrono::ChMaterialCompositionStrategy_*,_false>._M_head_impl;
  local_78.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (cinfo->shapeA->m_material).
       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (cinfo->shapeA->m_material).
            super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_78.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_78.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        goto LAB_0054e24b;
      }
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
LAB_0054e24b:
  local_88.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (cinfo->shapeB->m_material).
       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (cinfo->shapeB->m_material).
            super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_88.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_88.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_01;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
        goto LAB_0054e2a4;
      }
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
    this_01->_M_use_count = this_01->_M_use_count + 1;
  }
LAB_0054e2a4:
  ChMaterialCompositeNSC::ChMaterialCompositeNSC(&local_58,strategy,&local_78,&local_88);
  if (local_88.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (local_78.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (*(this->super_ChContactContainer).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x43])
            (&local_68,this);
  plVar3 = local_68;
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (plVar3 != (long *)0x0) {
    (*(this->super_ChContactContainer).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x43])
              (&local_68,this);
    (**(code **)(*local_68 + 0x10))(local_68,cinfo,&local_58);
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
  }
  InsertContact(this,cinfo,&local_58);
  return;
}

Assistant:

void ChContactContainerNSC::AddContact(const collision::ChCollisionInfo& cinfo) {
    assert(cinfo.modelA->GetContactable());
    assert(cinfo.modelB->GetContactable());

    auto contactableA = cinfo.modelA->GetContactable();
    auto contactableB = cinfo.modelB->GetContactable();

    // Do nothing if any of the contactables is not contact-active
    if (!contactableA->IsContactActive() && !contactableB->IsContactActive())
        return;

    // Check that the two collision models are compatible with complementarity contact.
    if (cinfo.shapeA->GetContactMethod() != ChContactMethod::NSC ||
        cinfo.shapeB->GetContactMethod() != ChContactMethod::NSC) {
        return;
    }

    // Create the composite material
    ChMaterialCompositeNSC cmat(GetSystem()->composition_strategy.get(),
                                std::static_pointer_cast<ChMaterialSurfaceNSC>(cinfo.shapeA->GetMaterial()),
                                std::static_pointer_cast<ChMaterialSurfaceNSC>(cinfo.shapeB->GetMaterial()));

    // Check for a user-provided callback to modify the material
    if (GetAddContactCallback()) {
        GetAddContactCallback()->OnAddContact(cinfo, &cmat);
    }

    InsertContact(cinfo, cmat);
}